

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O0

ostream * test_detail::
          print_range<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,burst::identity_fn>
                    (ostream *stream,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *range)

{
  anon_class_16_2_aa65ec36 __f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  reference value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_iterator cVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  ostream *poVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *range_local;
  ostream *stream_local;
  
  local_20 = range;
  range_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)stream;
  std::operator<<(stream,"[");
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(local_20);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(local_20);
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
  pvVar1 = range_local;
  if (bVar2) {
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (local_20);
    value = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_38);
    pbVar3 = burst::identity_fn::operator()((identity_fn *)((long)&stream_local + 7),value);
    std::operator<<((ostream *)pvVar1,(string *)pbVar3);
    cVar4 = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (local_20);
    __first = std::
              next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (cVar4._M_current,1);
    cVar4 = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (local_20);
    __f.proj = (identity_fn *)((long)&stream_local + 7);
    __f.stream = (ostream *)range_local;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,test_detail::print_range<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,burst::identity_fn>(std::ostream&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (__first,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )cVar4._M_current,__f);
  }
  poVar5 = std::operator<<((ostream *)range_local,"]");
  return poVar5;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }